

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O0

void __thiscall
optimization::graph_color::Conflict_Map::merge(Conflict_Map *this,VarId *var1,VarId *var2)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  value_type *__x;
  VarId *in_RDX;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *in_RSI;
  long in_RDI;
  VarId *var;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  mapped_type old_merged_var;
  int priority;
  key_type *in_stack_fffffffffffffec8;
  VarId *in_stack_fffffffffffffed0;
  value_type *in_stack_fffffffffffffed8;
  pair<const_mir::inst::VarId,_int> *in_stack_fffffffffffffee0;
  VarId *__x_00;
  key_type *in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff11;
  _Self local_80;
  _Self local_78;
  mapped_type *local_70;
  VarId local_68;
  int local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  __x_00 = in_RDX;
  sVar2 = std::
          map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::count((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                   *)in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->first);
  if (sVar2 == 0) {
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1ae9b1);
    in_stack_fffffffffffffee0 =
         (pair<const_mir::inst::VarId,_int> *)
         std::
         map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
         ::operator[]((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
                      in_stack_ffffffffffffff08);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    operator=((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
               *)in_stack_fffffffffffffed0,
              (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
               *)in_stack_fffffffffffffec8);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::~set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1ae9ed);
  }
  pmVar3 = std::
           map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
           ::at(in_RSI,(key_type_conflict *)__x_00);
  local_58 = pmVar3->priority;
  sVar4 = std::
          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          ::count((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   *)in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->first);
  if (sVar4 == 0) {
    std::
    map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
    ::operator[]((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  *)CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
    mir::inst::VarId::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    std::
    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::operator[]((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                  *)CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    insert((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
           in_RSI,__x_00);
    std::pair<const_mir::inst::VarId,_int>::pair<mir::inst::VarId_&,_int_&,_true>
              (in_stack_fffffffffffffee0,&in_stack_fffffffffffffed8->first,(int *)(in_RDI + 0x160));
    std::
    map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
    ::insert((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
              *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  else {
    std::
    map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
    ::at((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          *)in_RSI,__x_00);
    mir::inst::VarId::VarId(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    bVar1 = mir::inst::VarId::operator==(&local_68,in_RDX);
    if (!bVar1) {
      local_70 = std::
                 map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                 ::at((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                       *)in_RSI,__x_00);
      local_78._M_node =
           (_Base_ptr)
           std::
           set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
           begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_fffffffffffffec8);
      local_80._M_node =
           (_Base_ptr)
           std::
           set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
           end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_fffffffffffffec8);
      while (bVar1 = std::operator!=(&local_78,&local_80), bVar1) {
        std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                  ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1aeb10);
        std::
        map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
        ::operator[]((map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                      *)CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08);
        mir::inst::VarId::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        std::
        map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
        ::operator[]((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                      *)CONCAT71(in_stack_ffffffffffffff11,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        insert((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_RSI,__x_00);
        pmVar3 = std::
                 map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 ::at(in_RSI,(key_type_conflict *)__x_00);
        local_58 = pmVar3->priority + local_58;
        std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                  ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_fffffffffffffed0);
      }
      __x = (value_type *)(in_RDI + 0x160);
      std::pair<const_mir::inst::VarId,_int>::pair<mir::inst::VarId_&,_int_&,_true>
                (in_stack_fffffffffffffee0,(VarId *)__x,(int *)in_stack_fffffffffffffed0);
      std::
      map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
      ::insert((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
                *)in_stack_fffffffffffffee0,__x);
      std::
      map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::erase((map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
               *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
  }
  return;
}

Assistant:

void merge(mir::inst::VarId var1, mir::inst::VarId var2) {
    if (!merged_Map.count(var2)) {
      merged_Map[var2] = std::set<mir::inst::VarId>();
    }
    int priority = func.variables.at(var1.id).priority;
    if (merged_var_Map.count(var1)) {
      auto old_merged_var = merged_var_Map.at(var1);
      if (old_merged_var == var2) {
        return;
      }
      for (auto& var : merged_Map.at(old_merged_var)) {
        merged_var_Map[var] = var2;
        merged_Map[var2].insert(var);
        priority += func.variables.at(var.id).priority;
      }
      priority_map.insert({var2, priority});
      merged_Map.erase(old_merged_var);
    } else {
      merged_var_Map[var1] = var2;
      merged_Map[var2].insert(var1);
      priority_map.insert({var2, priority});
    }
  }